

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsMessageReserve(HelicsMessage message,int reservedSize,HelicsError *err)

{
  Message *pMVar1;
  size_t in_RDX;
  undefined4 in_ESI;
  Message *mess;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsMessage in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  pMVar1 = getMessageObj(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pMVar1 != (Message *)0x0) {
    helics::SmallBuffer::reserve((SmallBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  }
  return;
}

Assistant:

void helicsMessageReserve(HelicsMessage message, int reservedSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.reserve(reservedSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}